

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltwise.cpp
# Opt level: O2

int __thiscall
ncnn::Eltwise::forward
          (Eltwise *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float fVar1;
  int iVar2;
  int _h;
  Mat *this_00;
  Mat *this_01;
  pointer pMVar3;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  int i;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  uint _c;
  int q;
  uint uVar12;
  float fVar13;
  Mat local_98;
  pointer local_58;
  Eltwise *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  this_00 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  iVar2 = this_00->w;
  _h = this_00->h;
  _c = this_00->c;
  this_01 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create(this_01,iVar2,_h,_c,this_00->elemsize,opt->blob_allocator);
  iVar7 = -100;
  if ((this_01->data != (void *)0x0) && ((long)this_01->c * this_01->cstep != 0)) {
    uVar12 = _h * iVar2;
    iVar2 = this->op_type;
    if (iVar2 == 2) {
      pMVar3 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar11 = 0;
      if ((int)uVar12 < 1) {
        uVar12 = uVar11;
      }
      if ((int)_c < 1) {
        _c = uVar11;
      }
      for (; uVar11 != _c; uVar11 = uVar11 + 1) {
        Mat::channel(&local_98,this_00,uVar11);
        pvVar4 = local_98.data;
        Mat::~Mat(&local_98);
        Mat::channel(&local_98,pMVar3 + 1,uVar11);
        pvVar5 = local_98.data;
        Mat::~Mat(&local_98);
        Mat::channel(&local_98,this_01,uVar11);
        pvVar6 = local_98.data;
        Mat::~Mat(&local_98);
        for (uVar8 = 0; uVar12 != uVar8; uVar8 = uVar8 + 1) {
          fVar13 = *(float *)((long)pvVar5 + uVar8 * 4);
          fVar1 = *(float *)((long)pvVar4 + uVar8 * 4);
          if (fVar13 <= fVar1) {
            fVar13 = fVar1;
          }
          *(float *)((long)pvVar6 + uVar8 * 4) = fVar13;
        }
      }
      for (uVar8 = 2;
          pMVar3 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_start,
          uVar8 < (ulong)((long)(bottom_blobs->
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                                super__Vector_impl_data._M_finish - (long)pMVar3 >> 6);
          uVar8 = uVar8 + 1) {
        for (uVar11 = 0; uVar11 != _c; uVar11 = uVar11 + 1) {
          Mat::channel(&local_98,pMVar3 + uVar8,uVar11);
          pvVar4 = local_98.data;
          Mat::~Mat(&local_98);
          Mat::channel(&local_98,this_01,uVar11);
          pvVar5 = local_98.data;
          Mat::~Mat(&local_98);
          for (uVar9 = 0; uVar12 != uVar9; uVar9 = uVar9 + 1) {
            fVar13 = *(float *)((long)pvVar4 + uVar9 * 4);
            fVar1 = *(float *)((long)pvVar5 + uVar9 * 4);
            if (fVar13 <= fVar1) {
              fVar13 = fVar1;
            }
            *(float *)((long)pvVar5 + uVar9 * 4) = fVar13;
          }
        }
      }
    }
    else if (iVar2 == 1) {
      local_58 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start + 1;
      if ((this->coeffs).w == 0) {
        uVar11 = 0;
        if ((int)uVar12 < 1) {
          uVar12 = uVar11;
        }
        if ((int)_c < 1) {
          _c = uVar11;
        }
        for (; uVar11 != _c; uVar11 = uVar11 + 1) {
          Mat::channel(&local_98,this_00,uVar11);
          pvVar4 = local_98.data;
          Mat::~Mat(&local_98);
          Mat::channel(&local_98,local_58,uVar11);
          pvVar5 = local_98.data;
          Mat::~Mat(&local_98);
          Mat::channel(&local_98,this_01,uVar11);
          pvVar6 = local_98.data;
          Mat::~Mat(&local_98);
          for (uVar8 = 0; uVar12 != uVar8; uVar8 = uVar8 + 1) {
            *(float *)((long)pvVar6 + uVar8 * 4) =
                 *(float *)((long)pvVar5 + uVar8 * 4) + *(float *)((long)pvVar4 + uVar8 * 4);
          }
        }
        for (uVar8 = 2;
            pMVar3 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_start,
            uVar8 < (ulong)((long)(bottom_blobs->
                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                                  .super__Vector_impl_data._M_finish - (long)pMVar3 >> 6);
            uVar8 = uVar8 + 1) {
          for (uVar11 = 0; uVar11 != _c; uVar11 = uVar11 + 1) {
            Mat::channel(&local_98,pMVar3 + uVar8,uVar11);
            pvVar4 = local_98.data;
            Mat::~Mat(&local_98);
            Mat::channel(&local_98,this_01,uVar11);
            pvVar5 = local_98.data;
            Mat::~Mat(&local_98);
            for (uVar9 = 0; uVar12 != uVar9; uVar9 = uVar9 + 1) {
              *(float *)((long)pvVar5 + uVar9 * 4) =
                   *(float *)((long)pvVar5 + uVar9 * 4) + *(float *)((long)pvVar4 + uVar9 * 4);
            }
          }
        }
      }
      else {
        local_48 = *(this->coeffs).data;
        uVar9 = 0;
        uVar8 = (ulong)uVar12;
        if ((int)uVar12 < 1) {
          uVar8 = uVar9;
        }
        if ((int)_c < 1) {
          _c = 0;
        }
        uStack_40 = 0;
        local_50 = this;
        while (uVar12 = (uint)uVar9, uVar12 != _c) {
          Mat::channel(&local_98,this_00,uVar12);
          pvVar4 = local_98.data;
          Mat::~Mat(&local_98);
          Mat::channel(&local_98,local_58,uVar12);
          pvVar5 = local_98.data;
          Mat::~Mat(&local_98);
          Mat::channel(&local_98,this_01,uVar12);
          pvVar6 = local_98.data;
          Mat::~Mat(&local_98);
          for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
            *(float *)((long)pvVar6 + uVar9 * 4) =
                 *(float *)((long)pvVar5 + uVar9 * 4) * local_48._4_4_ +
                 *(float *)((long)pvVar4 + uVar9 * 4) * (float)local_48;
          }
          uVar9 = (ulong)(uVar12 + 1);
        }
        for (uVar9 = 2;
            pMVar3 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_start,
            uVar9 < (ulong)((long)(bottom_blobs->
                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                                  .super__Vector_impl_data._M_finish - (long)pMVar3 >> 6);
            uVar9 = uVar9 + 1) {
          fVar13 = *(float *)((long)(local_50->coeffs).data + uVar9 * 4);
          for (uVar12 = 0; uVar12 != _c; uVar12 = uVar12 + 1) {
            Mat::channel(&local_98,pMVar3 + uVar9,uVar12);
            pvVar4 = local_98.data;
            Mat::~Mat(&local_98);
            Mat::channel(&local_98,this_01,uVar12);
            pvVar5 = local_98.data;
            Mat::~Mat(&local_98);
            for (uVar10 = 0; uVar8 != uVar10; uVar10 = uVar10 + 1) {
              *(float *)((long)pvVar5 + uVar10 * 4) =
                   *(float *)((long)pvVar4 + uVar10 * 4) * fVar13 +
                   *(float *)((long)pvVar5 + uVar10 * 4);
            }
          }
        }
      }
    }
    else {
      if (iVar2 != 0) {
        return 0;
      }
      pMVar3 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar11 = 0;
      if ((int)uVar12 < 1) {
        uVar12 = uVar11;
      }
      if ((int)_c < 1) {
        _c = uVar11;
      }
      for (; uVar11 != _c; uVar11 = uVar11 + 1) {
        Mat::channel(&local_98,this_00,uVar11);
        pvVar4 = local_98.data;
        Mat::~Mat(&local_98);
        Mat::channel(&local_98,pMVar3 + 1,uVar11);
        pvVar5 = local_98.data;
        Mat::~Mat(&local_98);
        Mat::channel(&local_98,this_01,uVar11);
        pvVar6 = local_98.data;
        Mat::~Mat(&local_98);
        for (uVar8 = 0; uVar12 != uVar8; uVar8 = uVar8 + 1) {
          *(float *)((long)pvVar6 + uVar8 * 4) =
               *(float *)((long)pvVar5 + uVar8 * 4) * *(float *)((long)pvVar4 + uVar8 * 4);
        }
      }
      for (uVar8 = 2;
          pMVar3 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_start,
          uVar8 < (ulong)((long)(bottom_blobs->
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                                super__Vector_impl_data._M_finish - (long)pMVar3 >> 6);
          uVar8 = uVar8 + 1) {
        for (uVar11 = 0; uVar11 != _c; uVar11 = uVar11 + 1) {
          Mat::channel(&local_98,pMVar3 + uVar8,uVar11);
          pvVar4 = local_98.data;
          Mat::~Mat(&local_98);
          Mat::channel(&local_98,this_01,uVar11);
          pvVar5 = local_98.data;
          Mat::~Mat(&local_98);
          for (uVar9 = 0; uVar12 != uVar9; uVar9 = uVar9 + 1) {
            *(float *)((long)pvVar5 + uVar9 * 4) =
                 *(float *)((long)pvVar5 + uVar9 * 4) * *(float *)((long)pvVar4 + uVar9 * 4);
          }
        }
      }
    }
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

int Eltwise::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int size = w * h;

    Mat& top_blob = top_blobs[0];
    top_blob.create(w, h, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (op_type == Operation_PROD)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                outptr[i] = ptr[i] * ptr1[i];
            }
        }

        for (size_t b=2; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob1 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i=0; i<size; i++)
                {
                    outptr[i] *= ptr[i];
                }
            }
        }
    }
    else if (op_type == Operation_SUM)
    {
        if (coeffs.w == 0)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i=0; i<size; i++)
                {
                    outptr[i] = ptr[i] + ptr1[i];
                }
            }

            for (size_t b=2; b<bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob1 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q=0; q<channels; q++)
                {
                    const float* ptr = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i=0; i<size; i++)
                    {
                        outptr[i] += ptr[i];
                    }
                }
            }
        }
        else
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            float coeff0 = coeffs[0];
            float coeff1 = coeffs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i=0; i<size; i++)
                {
                    outptr[i] = ptr[i] * coeff0 + ptr1[i] * coeff1;
                }
            }

            for (size_t b=2; b<bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob1 = bottom_blobs[b];
                float coeff = coeffs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q=0; q<channels; q++)
                {
                    const float* ptr = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i=0; i<size; i++)
                    {
                        outptr[i] += ptr[i] * coeff;
                    }
                }
            }
        }
    }
    else if (op_type == Operation_MAX)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                outptr[i] = std::max(ptr[i], ptr1[i]);
            }
        }

        for (size_t b=2; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob1 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i=0; i<size; i++)
                {
                    outptr[i] = std::max(outptr[i], ptr[i]);
                }
            }
        }
    }

    return 0;
}